

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-timer.c
# Opt level: O3

int run_test_timer_init(void)

{
  int iVar1;
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  int extraout_EAX_02;
  uv_loop_t *puVar2;
  uint64_t uVar3;
  uv_timer_t *loop;
  uv_loop_t *unaff_RBX;
  uint64_t eval_b;
  uint64_t eval_a;
  uv_timer_t handle;
  uv_timer_t uStack_2e0;
  uv_loop_t *puStack_248;
  code *pcStack_240;
  uv_loop_t *puStack_238;
  code *pcStack_230;
  void *pvStack_228;
  undefined1 auStack_220 [16];
  code *pcStack_210;
  code *pcStack_208;
  undefined1 auStack_200 [8];
  undefined1 auStack_1f8 [152];
  undefined1 auStack_160 [160];
  
  puVar2 = uv_default_loop();
  iVar1 = uv_timer_init(puVar2,(uv_timer_t *)&stack0xffffffffffffff60);
  if (iVar1 == 0) {
    uVar3 = uv_timer_get_repeat((uv_timer_t *)&stack0xffffffffffffff60);
    if (uVar3 != 0) goto LAB_00182a14;
    uv_timer_get_due_in((uv_timer_t *)&stack0xffffffffffffff60);
    iVar1 = uv_is_active((uv_handle_t *)&stack0xffffffffffffff60);
    if (iVar1 != 0) goto LAB_00182a28;
    unaff_RBX = uv_default_loop();
    uv_walk(unaff_RBX,close_walk_cb,(void *)0x0);
    uv_run(unaff_RBX,UV_RUN_DEFAULT);
    puVar2 = uv_default_loop();
    iVar1 = uv_loop_close(puVar2);
    if (iVar1 == 0) {
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    run_test_timer_init_cold_1();
LAB_00182a14:
    run_test_timer_init_cold_2();
    run_test_timer_init_cold_5();
LAB_00182a28:
    run_test_timer_init_cold_3();
  }
  run_test_timer_init_cold_4();
  auStack_200._4_4_ = 0;
  auStack_200._0_4_ = 1;
  pcStack_208 = (code *)0x182a50;
  auStack_160._152_8_ = unaff_RBX;
  puVar2 = uv_default_loop();
  pcStack_208 = (code *)0x182a60;
  iVar1 = uv_timer_init(puVar2,(uv_timer_t *)auStack_160);
  if (iVar1 == 0) {
    pcStack_208 = (code *)0x182a6d;
    puVar2 = uv_default_loop();
    pcStack_208 = (code *)0x182a7a;
    iVar1 = uv_timer_init(puVar2,(uv_timer_t *)auStack_1f8);
    if (iVar1 != 0) goto LAB_00182bd0;
    unaff_RBX = (uv_loop_t *)(auStack_200 + 4);
    puVar2 = (uv_loop_t *)auStack_160;
    pcStack_208 = (code *)0x182aa2;
    auStack_160._0_8_ = unaff_RBX;
    iVar1 = uv_timer_start((uv_timer_t *)puVar2,order_cb_a,0,0);
    if (iVar1 != 0) goto LAB_00182bd5;
    puVar2 = (uv_loop_t *)auStack_1f8;
    pcStack_208 = (code *)0x182ac5;
    auStack_1f8._0_8_ = (uv_loop_t *)auStack_200;
    iVar1 = uv_timer_start((uv_timer_t *)puVar2,order_cb_b,0,0);
    if (iVar1 != 0) goto LAB_00182bda;
    pcStack_208 = (code *)0x182ad2;
    puVar2 = uv_default_loop();
    pcStack_208 = (code *)0x182adc;
    iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
    if (iVar1 != 0) goto LAB_00182bdf;
    if (order_cb_called != 2) goto LAB_00182be4;
    puVar2 = (uv_loop_t *)auStack_160;
    pcStack_208 = (code *)0x182afe;
    iVar1 = uv_timer_stop((uv_timer_t *)puVar2);
    if (iVar1 != 0) goto LAB_00182be9;
    puVar2 = (uv_loop_t *)auStack_1f8;
    pcStack_208 = (code *)0x182b10;
    iVar1 = uv_timer_stop((uv_timer_t *)puVar2);
    if (iVar1 != 0) goto LAB_00182bee;
    order_cb_called = 0;
    puVar2 = (uv_loop_t *)auStack_1f8;
    pcStack_208 = (code *)0x182b3a;
    auStack_1f8._0_8_ = unaff_RBX;
    iVar1 = uv_timer_start((uv_timer_t *)puVar2,order_cb_b,0,0);
    if (iVar1 != 0) goto LAB_00182bf3;
    puVar2 = (uv_loop_t *)auStack_160;
    pcStack_208 = (code *)0x182b5d;
    auStack_160._0_8_ = (uv_loop_t *)auStack_200;
    iVar1 = uv_timer_start((uv_timer_t *)puVar2,order_cb_a,0,0);
    if (iVar1 != 0) goto LAB_00182bf8;
    pcStack_208 = (code *)0x182b6a;
    puVar2 = uv_default_loop();
    pcStack_208 = (code *)0x182b74;
    iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
    if (iVar1 != 0) goto LAB_00182bfd;
    if (order_cb_called != 2) goto LAB_00182c02;
    pcStack_208 = (code *)0x182b8a;
    unaff_RBX = uv_default_loop();
    pcStack_208 = (code *)0x182b9e;
    uv_walk(unaff_RBX,close_walk_cb,(void *)0x0);
    pcStack_208 = (code *)0x182ba8;
    uv_run(unaff_RBX,UV_RUN_DEFAULT);
    pcStack_208 = (code *)0x182bad;
    puVar2 = uv_default_loop();
    pcStack_208 = (code *)0x182bb5;
    iVar1 = uv_loop_close(puVar2);
    if (iVar1 == 0) {
      pcStack_208 = (code *)0x182bbe;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_208 = (code *)0x182bd0;
    run_test_timer_order_cold_1();
LAB_00182bd0:
    pcStack_208 = (code *)0x182bd5;
    run_test_timer_order_cold_2();
LAB_00182bd5:
    pcStack_208 = (code *)0x182bda;
    run_test_timer_order_cold_3();
LAB_00182bda:
    pcStack_208 = (code *)0x182bdf;
    run_test_timer_order_cold_4();
LAB_00182bdf:
    pcStack_208 = (code *)0x182be4;
    run_test_timer_order_cold_5();
LAB_00182be4:
    pcStack_208 = (code *)0x182be9;
    run_test_timer_order_cold_6();
LAB_00182be9:
    pcStack_208 = (code *)0x182bee;
    run_test_timer_order_cold_7();
LAB_00182bee:
    pcStack_208 = (code *)0x182bf3;
    run_test_timer_order_cold_8();
LAB_00182bf3:
    pcStack_208 = (code *)0x182bf8;
    run_test_timer_order_cold_9();
LAB_00182bf8:
    pcStack_208 = (code *)0x182bfd;
    run_test_timer_order_cold_10();
LAB_00182bfd:
    pcStack_208 = (code *)0x182c02;
    run_test_timer_order_cold_11();
LAB_00182c02:
    pcStack_208 = (code *)0x182c07;
    run_test_timer_order_cold_12();
  }
  pcStack_208 = order_cb_a;
  run_test_timer_order_cold_13();
  iVar1 = order_cb_called;
  pcStack_208 = (code *)(ulong)(uint)order_cb_called;
  order_cb_called = order_cb_called + 1;
  if (iVar1 == *puVar2->data) {
    return iVar1;
  }
  pcStack_210 = order_cb_b;
  order_cb_a_cold_1();
  iVar1 = order_cb_called;
  pcStack_210 = (code *)(ulong)(uint)order_cb_called;
  order_cb_called = order_cb_called + 1;
  if (iVar1 == *puVar2->data) {
    return iVar1;
  }
  auStack_220._8_8_ = run_test_timer_huge_timeout;
  order_cb_b_cold_1();
  pcStack_230 = (code *)0x182c50;
  auStack_220._8_8_ = unaff_RBX;
  puVar2 = uv_default_loop();
  pcStack_230 = (code *)0x182c5f;
  iVar1 = uv_timer_init(puVar2,&tiny_timer);
  if (iVar1 == 0) {
    pcStack_230 = (code *)0x182c6c;
    puVar2 = uv_default_loop();
    pcStack_230 = (code *)0x182c7b;
    iVar1 = uv_timer_init(puVar2,&huge_timer1);
    if (iVar1 != 0) goto LAB_00182de0;
    pcStack_230 = (code *)0x182c88;
    puVar2 = uv_default_loop();
    pcStack_230 = (code *)0x182c97;
    iVar1 = uv_timer_init(puVar2,&huge_timer2);
    if (iVar1 != 0) goto LAB_00182de5;
    pcStack_230 = (code *)0x182cb9;
    iVar1 = uv_timer_start(&tiny_timer,tiny_timer_cb,1,0);
    if (iVar1 != 0) goto LAB_00182dea;
    unaff_RBX = (uv_loop_t *)0xffffffffffff;
    pcStack_230 = (code *)0x182ce3;
    iVar1 = uv_timer_start(&huge_timer1,tiny_timer_cb,0xffffffffffff,0);
    if (iVar1 != 0) goto LAB_00182def;
    pcStack_230 = (code *)0x182d07;
    iVar1 = uv_timer_start(&huge_timer2,tiny_timer_cb,0xffffffffffffffff,0);
    if (iVar1 != 0) goto LAB_00182df4;
    auStack_220._0_8_ = (void *)0x1;
    pcStack_230 = (code *)0x182d24;
    pvStack_228 = (void *)uv_timer_get_due_in(&tiny_timer);
    if ((void *)auStack_220._0_8_ != pvStack_228) goto LAB_00182df9;
    auStack_220._0_8_ = (void *)0xffffffffffff;
    pcStack_230 = (code *)0x182d48;
    pvStack_228 = (void *)uv_timer_get_due_in(&huge_timer1);
    if ((void *)auStack_220._0_8_ != pvStack_228) goto LAB_00182e06;
    auStack_220._0_8_ = (void *)0x0;
    pcStack_230 = (code *)0x182d70;
    pvStack_228 = (void *)uv_timer_get_due_in(&huge_timer2);
    if (pvStack_228 < (ulong)auStack_220._0_8_) goto LAB_00182e13;
    pcStack_230 = (code *)0x182d88;
    puVar2 = uv_default_loop();
    pcStack_230 = (code *)0x182d92;
    iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
    if (iVar1 != 0) goto LAB_00182e20;
    pcStack_230 = (code *)0x182d9f;
    unaff_RBX = uv_default_loop();
    pcStack_230 = (code *)0x182db3;
    uv_walk(unaff_RBX,close_walk_cb,(void *)0x0);
    pcStack_230 = (code *)0x182dbd;
    uv_run(unaff_RBX,UV_RUN_DEFAULT);
    pcStack_230 = (code *)0x182dc2;
    puVar2 = uv_default_loop();
    pcStack_230 = (code *)0x182dca;
    iVar1 = uv_loop_close(puVar2);
    if (iVar1 == 0) {
      pcStack_230 = (code *)0x182dd3;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_230 = (code *)0x182de0;
    run_test_timer_huge_timeout_cold_1();
LAB_00182de0:
    pcStack_230 = (code *)0x182de5;
    run_test_timer_huge_timeout_cold_2();
LAB_00182de5:
    pcStack_230 = (code *)0x182dea;
    run_test_timer_huge_timeout_cold_3();
LAB_00182dea:
    pcStack_230 = (code *)0x182def;
    run_test_timer_huge_timeout_cold_4();
LAB_00182def:
    pcStack_230 = (code *)0x182df4;
    run_test_timer_huge_timeout_cold_5();
LAB_00182df4:
    pcStack_230 = (code *)0x182df9;
    run_test_timer_huge_timeout_cold_6();
LAB_00182df9:
    pcStack_230 = (code *)0x182e06;
    run_test_timer_huge_timeout_cold_7();
LAB_00182e06:
    pcStack_230 = (code *)0x182e13;
    run_test_timer_huge_timeout_cold_8();
LAB_00182e13:
    puVar2 = (uv_loop_t *)auStack_220;
    pcStack_230 = (code *)0x182e20;
    run_test_timer_huge_timeout_cold_11();
LAB_00182e20:
    pcStack_230 = (code *)0x182e25;
    run_test_timer_huge_timeout_cold_9();
  }
  pcStack_230 = tiny_timer_cb;
  run_test_timer_huge_timeout_cold_10();
  if (puVar2 == (uv_loop_t *)&tiny_timer) {
    puStack_238 = (uv_loop_t *)0x182e45;
    uv_close((uv_handle_t *)&tiny_timer,(uv_close_cb)0x0);
    puStack_238 = (uv_loop_t *)0x182e53;
    uv_close((uv_handle_t *)&huge_timer1,(uv_close_cb)0x0);
    uv_close((uv_handle_t *)&huge_timer2,(uv_close_cb)0x0);
    return extraout_EAX;
  }
  puStack_238 = (uv_loop_t *)run_test_timer_huge_repeat;
  tiny_timer_cb_cold_1();
  pcStack_240 = (code *)0x182e6d;
  puStack_238 = unaff_RBX;
  loop = (uv_timer_t *)uv_default_loop();
  pcStack_240 = (code *)0x182e7c;
  iVar1 = uv_timer_init((uv_loop_t *)loop,&tiny_timer);
  if (iVar1 == 0) {
    pcStack_240 = (code *)0x182e89;
    loop = (uv_timer_t *)uv_default_loop();
    pcStack_240 = (code *)0x182e98;
    iVar1 = uv_timer_init((uv_loop_t *)loop,&huge_timer1);
    if (iVar1 != 0) goto LAB_00182f39;
    loop = &tiny_timer;
    pcStack_240 = (code *)0x182ebd;
    iVar1 = uv_timer_start(&tiny_timer,huge_repeat_cb,2,2);
    if (iVar1 != 0) goto LAB_00182f3e;
    loop = &huge_timer1;
    pcStack_240 = (code *)0x182ee0;
    iVar1 = uv_timer_start(&huge_timer1,huge_repeat_cb,1,0xffffffffffffffff);
    if (iVar1 != 0) goto LAB_00182f43;
    pcStack_240 = (code *)0x182ee9;
    loop = (uv_timer_t *)uv_default_loop();
    pcStack_240 = (code *)0x182ef3;
    iVar1 = uv_run((uv_loop_t *)loop,UV_RUN_DEFAULT);
    if (iVar1 != 0) goto LAB_00182f48;
    pcStack_240 = (code *)0x182efc;
    unaff_RBX = uv_default_loop();
    pcStack_240 = (code *)0x182f10;
    uv_walk(unaff_RBX,close_walk_cb,(void *)0x0);
    pcStack_240 = (code *)0x182f1a;
    uv_run(unaff_RBX,UV_RUN_DEFAULT);
    pcStack_240 = (code *)0x182f1f;
    loop = (uv_timer_t *)uv_default_loop();
    pcStack_240 = (code *)0x182f27;
    iVar1 = uv_loop_close((uv_loop_t *)loop);
    if (iVar1 == 0) {
      pcStack_240 = (code *)0x182f30;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_240 = (code *)0x182f39;
    run_test_timer_huge_repeat_cold_1();
LAB_00182f39:
    pcStack_240 = (code *)0x182f3e;
    run_test_timer_huge_repeat_cold_2();
LAB_00182f3e:
    pcStack_240 = (code *)0x182f43;
    run_test_timer_huge_repeat_cold_3();
LAB_00182f43:
    pcStack_240 = (code *)0x182f48;
    run_test_timer_huge_repeat_cold_4();
LAB_00182f48:
    pcStack_240 = (code *)0x182f4d;
    run_test_timer_huge_repeat_cold_5();
  }
  pcStack_240 = huge_repeat_cb;
  run_test_timer_huge_repeat_cold_6();
  if (huge_repeat_cb::ncalls == 0) {
    if (loop == &huge_timer1) {
      huge_repeat_cb::ncalls = 1;
      return extraout_EAX_00;
    }
  }
  else {
    if (loop == &tiny_timer) {
      huge_repeat_cb::ncalls = huge_repeat_cb::ncalls + 1;
      if (huge_repeat_cb::ncalls != 10) {
        return extraout_EAX_00;
      }
      puStack_248 = (uv_loop_t *)0x182f84;
      uv_close((uv_handle_t *)&tiny_timer,(uv_close_cb)0x0);
      uv_close((uv_handle_t *)&huge_timer1,(uv_close_cb)0x0);
      return extraout_EAX_01;
    }
    puStack_248 = (uv_loop_t *)0x182fb0;
    huge_repeat_cb_cold_1();
  }
  puStack_248 = (uv_loop_t *)run_test_timer_run_once;
  huge_repeat_cb_cold_2();
  puStack_248 = unaff_RBX;
  puVar2 = uv_default_loop();
  iVar1 = uv_timer_init(puVar2,&uStack_2e0);
  if (iVar1 == 0) {
    iVar1 = uv_timer_start(&uStack_2e0,timer_run_once_timer_cb,0,0);
    if (iVar1 != 0) goto LAB_001830cd;
    puVar2 = uv_default_loop();
    iVar1 = uv_run(puVar2,UV_RUN_ONCE);
    if (iVar1 != 0) goto LAB_001830d2;
    if (timer_run_once_timer_cb_called != 1) goto LAB_001830d7;
    iVar1 = uv_timer_start(&uStack_2e0,timer_run_once_timer_cb,1,0);
    if (iVar1 != 0) goto LAB_001830dc;
    puVar2 = uv_default_loop();
    iVar1 = uv_run(puVar2,UV_RUN_ONCE);
    if (iVar1 != 0) goto LAB_001830e1;
    if (timer_run_once_timer_cb_called != 2) goto LAB_001830e6;
    uv_close((uv_handle_t *)&uStack_2e0,(uv_close_cb)0x0);
    puVar2 = uv_default_loop();
    iVar1 = uv_run(puVar2,UV_RUN_ONCE);
    if (iVar1 == 0) {
      puVar2 = uv_default_loop();
      uv_walk(puVar2,close_walk_cb,(void *)0x0);
      uv_run(puVar2,UV_RUN_DEFAULT);
      puVar2 = uv_default_loop();
      iVar1 = uv_loop_close(puVar2);
      if (iVar1 == 0) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_001830f0;
    }
  }
  else {
    run_test_timer_run_once_cold_1();
LAB_001830cd:
    run_test_timer_run_once_cold_2();
LAB_001830d2:
    run_test_timer_run_once_cold_3();
LAB_001830d7:
    run_test_timer_run_once_cold_4();
LAB_001830dc:
    run_test_timer_run_once_cold_5();
LAB_001830e1:
    run_test_timer_run_once_cold_6();
LAB_001830e6:
    run_test_timer_run_once_cold_7();
  }
  run_test_timer_run_once_cold_8();
LAB_001830f0:
  run_test_timer_run_once_cold_9();
  timer_run_once_timer_cb_called = timer_run_once_timer_cb_called + 1;
  return extraout_EAX_02;
}

Assistant:

TEST_IMPL(timer_init) {
  uv_timer_t handle;

  ASSERT(0 == uv_timer_init(uv_default_loop(), &handle));
  ASSERT(0 == uv_timer_get_repeat(&handle));
  ASSERT_UINT64_LE(0, uv_timer_get_due_in(&handle));
  ASSERT(0 == uv_is_active((uv_handle_t*) &handle));

  MAKE_VALGRIND_HAPPY();
  return 0;
}